

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall
NavierStokesBase::SyncProjInterp
          (NavierStokesBase *this,MultiFab *phi,int c_lev,MultiFab *P_new,MultiFab *P_old,int f_lev,
          IntVect *ratio)

{
  DistributionMapping *a_dm;
  undefined8 *puVar1;
  element_type *peVar2;
  pointer pGVar3;
  Geometry *pGVar4;
  double *pdVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Periodicity *period;
  Arena *arena;
  int *piVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  bool bVar23;
  initializer_list<int> __l;
  FabFactory<amrex::FArrayBox> *local_3f0;
  FabArray<amrex::FArrayBox> *local_3e8;
  long local_3e0;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> local_3d8;
  Geometry *local_3c0;
  Geometry *local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  long local_388;
  long local_380;
  Box local_374;
  FArrayBox fine_phi;
  MFIter mfi;
  Elixir fine_phi_i;
  Array4<double> local_298;
  Array4<double> local_258;
  BoxArray crse_ba;
  MultiFab crse_phi;
  
  peVar2 = (P_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar22 = (int)((long)(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data >> 2) * -0x49249249;
  local_3e8 = &P_old->super_FabArray<amrex::FArrayBox>;
  amrex::BoxArray::BoxArray(&crse_ba,(long)(int)uVar22);
  if (0 < (int)uVar22) {
    lVar16 = 0;
    uVar20 = 0;
    do {
      amrex::BATransformer::operator()
                ((Box *)&mfi,
                 &(P_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat,
                 (Box *)(*(long *)&(((P_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                     boxarray.m_ref.
                                     super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)->m_abox).
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data + lVar16));
      amrex::NodeBilinear::CoarseBox
                ((Box *)&crse_phi,(NodeBilinear *)&amrex::node_bilinear_interp,(Box *)&mfi,ratio);
      amrex::BoxArray::set(&crse_ba,(int)uVar20,(Box *)&crse_phi);
      uVar20 = uVar20 + 1;
      lVar16 = lVar16 + 0x1c;
    } while ((uVar22 & 0x7fffffff) != uVar20);
  }
  local_3d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x48);
  local_3d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_3d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
       super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
       super__Vector_impl_data._M_start + 3;
  lVar16 = 0;
  do {
    puVar1 = (undefined8 *)
             ((long)(local_3d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                     super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                     super__Vector_impl_data._M_start)->bc + lVar16);
    *puVar1 = 0xfffffd66fffffd66;
    puVar1[1] = 0xfffffd66fffffd66;
    *(undefined8 *)
     ((long)(local_3d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_start)->bc + lVar16 + 0x10) = 0xfffffd66fffffd66;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x48);
  local_3d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_3d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
              super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
              super__Vector_impl_data._M_start + 3;
  pGVar3 = (((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x100000001;
  mfi.fabArray = (FabArrayBase *)CONCAT44(mfi.fabArray._4_4_,1);
  __l._M_len = 3;
  __l._M_array = (iterator)&mfi;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&crse_phi,__l,(allocator_type *)&fine_phi);
  local_3b8 = pGVar3 + c_lev;
  a_dm = &(P_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  amrex::makeEBFabFactory
            ((amrex *)&local_3f0,local_3b8,&crse_ba,a_dm,
             (Vector<int,_std::allocator<int>_> *)&crse_phi,basic);
  if (crse_phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase !=
      (_func_int **)0x0) {
    operator_delete(crse_phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase,
                    crse_phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op
                    ._4_8_ - (long)crse_phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                   _vptr_FabArrayBase);
  }
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  amrex::MultiFab::MultiFab(&crse_phi,&crse_ba,a_dm,1,0,(MFInfo *)&mfi,local_3f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&crse_phi.super_FabArray<amrex::FArrayBox>,1e+200,0,
             crse_phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
             &crse_phi.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow);
  period = amrex::Periodicity::NonPeriodic();
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  mfi.fabArray = (FabArrayBase *)((ulong)mfi.fabArray & 0xffffffff00000000);
  fine_phi.super_BaseFab<double>._vptr_BaseFab = (_func_int **)0x0;
  fine_phi.super_BaseFab<double>.super_DataAllocator.m_arena._0_4_ = 0;
  amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
            (&crse_phi.super_FabArray<amrex::FArrayBox>,&phi->super_FabArray<amrex::FArrayBox>,0,0,1
             ,(IntVect *)&mfi,(IntVect *)&fine_phi,period,COPY,(CPC *)0x0,false);
  amrex::EB_set_covered(&crse_phi,0.0);
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)P_new,true);
  if (mfi.currentIndex < mfi.endIndex) {
    local_3c0 = pGVar3 + f_lev;
    do {
      pGVar4 = local_3c0;
      amrex::MFIter::tilebox(&local_374,&mfi);
      amrex::FArrayBox::FArrayBox(&fine_phi,&local_374,1,true,false,(Arena *)0x0);
      arena = (Arena *)CONCAT44(fine_phi.super_BaseFab<double>.super_DataAllocator.m_arena._4_4_,
                                fine_phi.super_BaseFab<double>.super_DataAllocator.m_arena._0_4_);
      if (arena == (Arena *)0x0) {
        arena = amrex::The_Arena();
      }
      amrex::Gpu::Elixir::Elixir(&fine_phi_i,(void *)0x0,arena);
      piVar9 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar9 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + mfi.currentIndex;
      }
      amrex::NodeBilinear::interp
                ((NodeBilinear *)&amrex::node_bilinear_interp,
                 crse_phi.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[*piVar9],0,&fine_phi,0,1,
                 &fine_phi.super_BaseFab<double>.domain,ratio,local_3b8,pGVar4,&local_3d8,0,1,Device
                );
      iVar8 = fine_phi.super_BaseFab<double>.domain.bigend.vect[1];
      iVar7 = fine_phi.super_BaseFab<double>.domain.bigend.vect[0];
      iVar6 = fine_phi.super_BaseFab<double>.domain.smallend.vect[1];
      iVar12 = fine_phi.super_BaseFab<double>.domain.smallend.vect[0];
      pdVar5 = fine_phi.super_BaseFab<double>.dptr;
      lVar21 = (long)fine_phi.super_BaseFab<double>.domain.smallend.vect[0];
      lVar17 = (long)fine_phi.super_BaseFab<double>.domain.smallend.vect[1];
      lVar16 = (long)fine_phi.super_BaseFab<double>.domain.smallend.vect[2];
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_258,&P_new->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_298,local_3e8,&mfi);
      if (local_374.smallend.vect[2] <= local_374.bigend.vect[2]) {
        lVar10 = (long)((iVar7 - iVar12) + 1);
        lVar13 = (long)local_374.smallend.vect[1];
        lVar14 = (long)local_374.smallend.vect[0];
        local_3b0 = lVar13 * 8 + lVar17 * -8;
        local_3a0 = (lVar13 - local_298.begin.y) * local_298.jstride * 8 + lVar14 * 8 +
                    (long)local_298.begin.x * -8 + (long)local_298.p;
        local_380 = local_298.kstride * 8;
        local_3a8 = (lVar13 - local_258.begin.y) * local_258.jstride * 8 + lVar14 * 8 +
                    (long)local_258.begin.x * -8 + (long)local_258.p;
        local_388 = -(long)local_298.begin.z;
        local_390 = local_258.kstride * 8;
        local_398 = -(long)local_258.begin.z;
        local_3e0 = (long)((iVar8 - iVar6) + 1) * 8;
        iVar12 = local_374.smallend.vect[2];
        do {
          if (local_374.smallend.vect[1] <= local_374.bigend.vect[1]) {
            lVar17 = (long)iVar12;
            lVar15 = (local_388 + lVar17) * local_380 + local_3a0;
            lVar18 = (local_398 + lVar17) * local_390 + local_3a8;
            lVar19 = (long)pdVar5 +
                     ((lVar17 - lVar16) * local_3e0 + local_3b0) * lVar10 + lVar14 * 8 + lVar21 * -8
            ;
            lVar17 = lVar13;
            do {
              if (local_374.smallend.vect[0] <= local_374.bigend.vect[0]) {
                lVar11 = 0;
                do {
                  *(double *)(lVar18 + lVar11 * 8) =
                       *(double *)(lVar19 + lVar11 * 8) + *(double *)(lVar18 + lVar11 * 8);
                  *(double *)(lVar15 + lVar11 * 8) =
                       *(double *)(lVar19 + lVar11 * 8) + *(double *)(lVar15 + lVar11 * 8);
                  lVar11 = lVar11 + 1;
                } while ((local_374.bigend.vect[0] - local_374.smallend.vect[0]) + 1 != (int)lVar11)
                ;
              }
              lVar17 = lVar17 + 1;
              lVar15 = lVar15 + local_298.jstride * 8;
              lVar18 = lVar18 + local_258.jstride * 8;
              lVar19 = lVar19 + lVar10 * 8;
            } while (local_374.bigend.vect[1] + 1 != (int)lVar17);
          }
          bVar23 = iVar12 != local_374.bigend.vect[2];
          iVar12 = iVar12 + 1;
        } while (bVar23);
      }
      amrex::Gpu::Elixir::~Elixir(&fine_phi_i);
      fine_phi.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080bbd8;
      amrex::BaseFab<double>::clear(&fine_phi.super_BaseFab<double>);
      amrex::MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  amrex::MFIter::~MFIter(&mfi);
  amrex::EB_set_covered(P_new,0.0);
  amrex::EB_set_covered((MultiFab *)local_3e8,0.0);
  amrex::MultiFab::~MultiFab(&crse_phi);
  if (local_3f0 != (FabFactory<amrex::FArrayBox> *)0x0) {
    (*local_3f0->_vptr_FabFactory[1])();
  }
  if (local_3d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  amrex::BoxArray::~BoxArray(&crse_ba);
  return;
}

Assistant:

void
NavierStokesBase::SyncProjInterp (MultiFab& phi,
                                  int       c_lev,
                                  MultiFab& P_new,
                                  MultiFab& P_old,
                                  int       f_lev,
                                  IntVect&  ratio)
{
    BL_PROFILE("NavierStokesBase:::SyncProjInterp()");

    const BoxArray& P_grids = P_new.boxArray();
    const int       N       = P_grids.size();

    BoxArray crse_ba(N);

#ifdef _OPENMP
#pragma omp parallel for
#endif
    for (int i = 0; i < N; i++)
        crse_ba.set(i,node_bilinear_interp.CoarseBox(P_grids[i],ratio));

    // None  of these 3 are actually used by node_bilinear_interp()
    Vector<BCRec> bc(AMREX_SPACEDIM);
    const Geometry& fgeom   = parent->Geom(f_lev);
    const Geometry& cgeom   = parent->Geom(c_lev);

#ifdef AMREX_USE_EB
    // I am unsure of EBSupport and ng (set to 1 here)
    // need 1 ghost cell to use EB_set_covered on nodal MF
    // Factory is always CC, regardless of status of crse_ba
    auto factory = makeEBFabFactory(cgeom,crse_ba,P_new.DistributionMap(),{1,1,1},EBSupport::basic);
    MultiFab     crse_phi(crse_ba,P_new.DistributionMap(),1,0,MFInfo(),*factory);

#else
    MultiFab     crse_phi(crse_ba,P_new.DistributionMap(),1,0);
#endif

    crse_phi.setVal(1.e200);
    crse_phi.ParallelCopy(phi,0,0,1);

#ifdef AMREX_USE_EB
    // FIXME -
    // For now, just zero covered fine cells. Better interpolation to come...
    ///
    EB_set_covered(crse_phi,0.);
#endif

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(P_new,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
	const Box&  bx     = mfi.tilebox();
	FArrayBox fine_phi(bx,1);
	Elixir fine_phi_i = fine_phi.elixir();
	node_bilinear_interp.interp(crse_phi[mfi],0,fine_phi,0,1,
				    fine_phi.box(),ratio,cgeom,fgeom,bc,
				    0,Press_Type,RunOn::Gpu);

	auto const& f_phi    = fine_phi.array();
	auto const& p_new    = P_new.array(mfi);
	auto const& p_old    = P_old.array(mfi);
	amrex::ParallelFor(bx, [f_phi, p_old, p_new]
        AMREX_GPU_DEVICE(int i, int j, int k) noexcept
        {
	  p_new(i,j,k) += f_phi(i,j,k);
	  p_old(i,j,k) += f_phi(i,j,k);
	});
    }

#ifdef AMREX_USE_EB
    // FIXME? - this can probably go after new interpolation is implemented
    EB_set_covered(P_new,0.);
    EB_set_covered(P_old,0.);
#endif

}